

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::StateType::StateType(StateType *this,StateType *from)

{
  ulong uVar1;
  ValueType *from_00;
  ValueType *this_00;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__StateType_004b1c00;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  from_00 = from->wrappedtype_;
  if (from_00 == (ValueType *)0x0 || from == (StateType *)_StateType_default_instance_) {
    this_00 = (ValueType *)0x0;
  }
  else {
    this_00 = (ValueType *)operator_new(0x20);
    ValueType::ValueType(this_00,from_00);
  }
  this->wrappedtype_ = this_00;
  return;
}

Assistant:

StateType::StateType(const StateType& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_wrappedtype()) {
    wrappedtype_ = new ::CoreML::Specification::MILSpec::ValueType(*from.wrappedtype_);
  } else {
    wrappedtype_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.StateType)
}